

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

SectionHdrWrapper * __thiscall
PEFile::addNewSection(PEFile *this,QString *name,bufsize_t r_size,bufsize_t v_size)

{
  QMutex *mutex;
  AbstractByteBuffer AVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar6;
  ulong uVar7;
  SectionHdrWrapper *pSVar8;
  size_t __n;
  uint64_t size;
  long lVar9;
  IMAGE_SECTION_HEADER secHdr;
  WatchedLocker lock;
  WatchedLocker lock_1;
  bufsize_t local_138;
  bufsize_t local_130;
  QArrayData *local_128;
  undefined8 *local_120;
  long local_118;
  QMutex *local_110;
  IMAGE_SECTION_HEADER local_108;
  SectionHdrWrapper local_e0;
  WatchedLocker local_68;
  
  if (v_size != 0 || r_size != 0) {
    mutex = &this->m_peMutex;
    WatchedLocker::WatchedLocker((WatchedLocker *)&local_e0,mutex,false,"addNewSection");
    bVar2 = _canAddNewSection(this);
    local_110 = mutex;
    if (bVar2) {
      if (v_size == 0) {
        v_size = r_size;
      }
      iVar4 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,1);
      iVar5 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x10])(this,1);
      local_138 = buf_util::roundupToUnit
                            (CONCAT44(extraout_var,iVar4),CONCAT44(extraout_var_00,iVar5));
      iVar4 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,2);
      iVar5 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x10])(this,2);
      local_130 = buf_util::roundupToUnit
                            (CONCAT44(extraout_var_01,iVar4),CONCAT44(extraout_var_02,iVar5));
      iVar4 = (*(this->optHdr->super_PEElementWrapper).super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1d])
                        (this->optHdr,0x13,0xffffffffffffffff,local_130 + v_size);
      cVar3 = (char)iVar4;
      if (cVar3 == '\0') {
        Logger::append(D_ERROR,"Can not change OptHdr!");
        Logger::append(D_ERROR,"Failed to change virtual size to: %X",local_130 + v_size);
      }
      lVar9 = local_138 + r_size;
    }
    else {
      local_130 = 0;
      cVar3 = '\0';
      local_138 = 0;
      lVar9 = 0;
    }
    WatchedLocker::~WatchedLocker((WatchedLocker *)&local_e0);
    if (cVar3 != '\0') {
      iVar4 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[10])(this,lVar9);
      if ((char)iVar4 == '\0') {
        Logger::append(D_ERROR,"Failed to resize");
        return (SectionHdrWrapper *)0x0;
      }
      WatchedLocker::WatchedLocker(&local_68,local_110,false,"addNewSection");
      iVar4 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                        (&(this->super_MappedExe).super_ExeWrappersContainer,5);
      if (CONCAT44(extraout_var_03,iVar4) == 0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = (long *)__dynamic_cast(CONCAT44(extraout_var_03,iVar4),&ExeElementWrapper::typeinfo
                                        ,&ExeNodeWrapper::typeinfo,0);
      }
      if (plVar6 == (long *)0x0) {
        pSVar8 = (SectionHdrWrapper *)0x0;
      }
      else {
        local_108.SizeOfRawData = 0;
        local_108.PointerToRawData = 0;
        local_108.PointerToRelocations = 0;
        local_108.PointerToLinenumbers = 0;
        local_108.Name[0] = '\0';
        local_108.Name[1] = '\0';
        local_108.Name[2] = '\0';
        local_108.Name[3] = '\0';
        local_108.Name[4] = '\0';
        local_108.Name[5] = '\0';
        local_108.Name[6] = '\0';
        local_108.Name[7] = '\0';
        local_108.Misc = (anon_union_4_2_d8da8690_for_Misc)0x0;
        local_108.VirtualAddress = 0;
        local_108.NumberOfRelocations = 0;
        local_108.NumberOfLinenumbers = 0;
        local_108.Characteristics = 0;
        uVar7 = (name->d).size;
        __n = 8;
        if (uVar7 < 8) {
          __n = uVar7;
        }
        if (uVar7 != 0) {
          QString::toUtf8_helper((QString *)&local_128);
          if (local_120 == (undefined8 *)0x0) {
            local_120 = &QByteArray::_empty;
          }
          local_e0.super_PENodeWrapper.super_ExeNodeWrapper.super_ExeElementWrapper.
          super_AbstractByteBuffer._vptr_AbstractByteBuffer =
               (_func_int **)&local_e0.super_PENodeWrapper.super_ExeNodeWrapper.parentNode;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,local_120,(long)local_120 + local_118);
          if (local_128 != (QArrayData *)0x0) {
            LOCK();
            (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_128,1,8);
            }
          }
          AVar1._vptr_AbstractByteBuffer =
               local_e0.super_PENodeWrapper.super_ExeNodeWrapper.super_ExeElementWrapper.
               super_AbstractByteBuffer._vptr_AbstractByteBuffer;
          memcpy(&local_108,
                 local_e0.super_PENodeWrapper.super_ExeNodeWrapper.super_ExeElementWrapper.
                 super_AbstractByteBuffer._vptr_AbstractByteBuffer,__n);
          if ((ExeNodeWrapper **)AVar1._vptr_AbstractByteBuffer !=
              &local_e0.super_PENodeWrapper.super_ExeNodeWrapper.parentNode) {
            operator_delete(AVar1._vptr_AbstractByteBuffer,
                            (ulong)((long)&((local_e0.super_PENodeWrapper.super_ExeNodeWrapper.
                                            parentNode)->super_ExeElementWrapper).
                                           super_AbstractByteBuffer._vptr_AbstractByteBuffer + 1));
          }
        }
        if (0xfffffffe < r_size) {
          r_size = 0xffffffff;
        }
        local_108.PointerToRawData = (DWORD)local_138;
        local_108.SizeOfRawData = (DWORD)r_size;
        uVar7 = 0xffffffff;
        if (v_size < 0xffffffff) {
          uVar7 = v_size;
        }
        local_108.VirtualAddress = (DWORD)local_130;
        local_108.Misc.PhysicalAddress = (DWORD)uVar7;
        SectionHdrWrapper::SectionHdrWrapper(&local_e0,this,&local_108);
        lVar9 = (**(code **)(*plVar6 + 0x140))(plVar6,&local_e0);
        if (lVar9 == 0) {
          pSVar8 = (SectionHdrWrapper *)0x0;
        }
        else {
          pSVar8 = (SectionHdrWrapper *)
                   __dynamic_cast(lVar9,&ExeNodeWrapper::typeinfo,&SectionHdrWrapper::typeinfo,0);
        }
        SectionHdrWrapper::~SectionHdrWrapper(&local_e0);
      }
      WatchedLocker::~WatchedLocker(&local_68);
      return pSVar8;
    }
  }
  return (SectionHdrWrapper *)0x0;
}

Assistant:

SectionHdrWrapper* PEFile::addNewSection(QString name, bufsize_t r_size, bufsize_t v_size)
{
    if (!r_size && !v_size) return nullptr; //nothing to add
    
    bufsize_t newSize = 0;
    bufsize_t roundedRawEnd = 0;
    bufsize_t roundedVirtualEnd = 0;
    SectionHdrWrapper* secHdrWr = nullptr;
    { //scope0
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        if (!_canAddNewSection()) {
            return nullptr;
        }

        if (!v_size) {
            v_size = r_size;
        }
        roundedRawEnd = buf_util::roundupToUnit(getMappedSize(Executable::RAW), getAlignment(Executable::RAW));
        roundedVirtualEnd = buf_util::roundupToUnit(getMappedSize(Executable::RVA), getAlignment(Executable::RVA));
        newSize = roundedRawEnd + r_size;
        const bufsize_t newVirtualSize = roundedVirtualEnd + v_size;
        if (setVirtualSize(newVirtualSize) == false) {
            Logger::append(Logger::D_ERROR, "Failed to change virtual size to: %X", newVirtualSize);
            return nullptr;
        }
    } //scope0
    
    // the PE file is resized and rewrapped:
    if (resize(newSize) == false) {
        Logger::append(Logger::D_ERROR, "Failed to resize");
        return nullptr;
    }
    
    { //scope1
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        // fetch again after resize:
        ExeNodeWrapper* sec = dynamic_cast<ExeNodeWrapper*>(getWrapper(PEFile::WR_SECTIONS));
        if (!sec) {
            return nullptr;
        }

        IMAGE_SECTION_HEADER secHdr;
        ::memset(&secHdr, 0, sizeof(IMAGE_SECTION_HEADER));

        //name copy:
        const size_t nameLen = name.length();
        const size_t bufSize = sizeof(secHdr.Name);
        const size_t copySize = (nameLen < bufSize) ? nameLen : bufSize;
        if (copySize) {
            ::memcpy(secHdr.Name, name.toStdString().c_str(), copySize);
        }
        secHdr.PointerToRawData = static_cast<DWORD>(roundedRawEnd);
        secHdr.VirtualAddress = static_cast<DWORD>(roundedVirtualEnd);
        secHdr.SizeOfRawData = MASK_TO_DWORD(r_size);
        secHdr.Misc.VirtualSize = MASK_TO_DWORD(v_size);

        SectionHdrWrapper wr(this, &secHdr);
        secHdrWr = dynamic_cast<SectionHdrWrapper*>(sec->addEntry(&wr));
    } //!scope1
    return secHdrWr;
}